

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

Meta * __thiscall spirv_cross::ParsedIR::find_meta(ParsedIR *this,ID id)

{
  __node_base_ptr p_Var1;
  Meta *pMVar2;
  _Hash_node_base *p_Var3;
  key_type local_c;
  
  p_Var3 = (_Hash_node_base *)0x0;
  local_c.id = id.id;
  p_Var1 = ::std::
           _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->meta)._M_h,(ulong)id.id % (this->meta)._M_h._M_bucket_count,&local_c,
                      (ulong)id.id);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var1->_M_nxt;
  }
  pMVar2 = (Meta *)(p_Var3 + 2);
  if (p_Var3 == (_Hash_node_base *)0x0) {
    pMVar2 = (Meta *)0x0;
  }
  return pMVar2;
}

Assistant:

const Meta *ParsedIR::find_meta(ID id) const
{
	auto itr = meta.find(id);
	if (itr != end(meta))
		return &itr->second;
	else
		return nullptr;
}